

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_dbg.c
# Opt level: O1

int tool_debug_cb(CURL *handle,curl_infotype type,char *data,size_t size,void *userdata)

{
  trace tVar1;
  GlobalConfig *config;
  size_t sVar2;
  char cVar3;
  int iVar4;
  time_t tVar5;
  tm *ptVar6;
  FILE *pFVar7;
  FILE **ppFVar8;
  size_t sVar9;
  long lVar10;
  char *pcVar11;
  FILE *__stream;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  timeval tVar17;
  char timebuf [20];
  curl_off_t xfer_id;
  char idsbuf [60];
  curl_off_t conn_id;
  char local_a8 [24];
  long local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78 [8];
  long local_38;
  
  __stream = (FILE *)tool_stderr;
  config = *(GlobalConfig **)((long)userdata + 0x528);
  if (config->tracetime == true) {
    tVar17 = tvnow();
    lVar10 = tVar17.tv_sec;
    if (hms_for_sec_cached_tv_sec != lVar10) {
      if (hms_for_sec_known_epoch == '\0') {
        tVar5 = time((time_t *)0x0);
        hms_for_sec_epoch_offset = tVar5 - lVar10;
        hms_for_sec_known_epoch = '\x01';
      }
      local_78[0] = hms_for_sec_epoch_offset + lVar10;
      ptVar6 = localtime((time_t *)local_78);
      curl_msnprintf(hms_for_sec_hms_buf,0xc,"%02d:%02d:%02d",ptVar6->tm_hour,ptVar6->tm_min,
                     ptVar6->tm_sec);
      hms_for_sec_cached_tv_sec = lVar10;
    }
    curl_msnprintf(local_a8,0x14,"%s.%06ld ",hms_for_sec_hms_buf,tVar17.tv_usec);
  }
  else {
    local_a8[0] = '\0';
  }
  if ((((handle == (CURL *)0x0) || (config->traceids != true)) ||
      (iVar4 = curl_easy_getinfo(handle,0x60003f,&local_90), iVar4 != 0)) || (local_90 < 0)) {
    local_78[0] = local_78[0] & 0xffffffffffffff00;
  }
  else {
    iVar4 = curl_easy_getinfo(handle,0x600040,&local_38);
    if (local_38 < 0 || iVar4 != 0) {
      curl_msnprintf(local_78,0x3c,"[%ld-x] ",local_90);
    }
    else {
      curl_msnprintf(local_78,0x3c,"[%ld-%ld] ",local_90);
    }
  }
  if (config->trace_stream == (FILE *)0x0) {
    pcVar11 = config->trace_dump;
    iVar4 = strcmp("-",pcVar11);
    if (iVar4 == 0) {
      ppFVar8 = (FILE **)&stdout;
    }
    else {
      iVar4 = strcmp("%",pcVar11);
      if (iVar4 != 0) {
        pFVar7 = fopen64(pcVar11,"w");
        config->trace_stream = (FILE *)pFVar7;
        config->trace_fopened = true;
        goto LAB_0010ac88;
      }
      ppFVar8 = &tool_stderr;
    }
    config->trace_stream = *ppFVar8;
  }
LAB_0010ac88:
  if ((FILE *)config->trace_stream != (FILE *)0x0) {
    __stream = (FILE *)config->trace_stream;
  }
  if (__stream == (FILE *)0x0) {
    warnf(config,"Failed to create/open output");
    return 0;
  }
  tVar1 = config->tracetype;
  if (tVar1 == TRACE_PLAIN) {
    if (type - CURLINFO_DATA_IN < 4) {
      if (tool_debug_cb_traced_data != '\0') {
        return 0;
      }
      if (config->isatty == true) {
        if (__stream == (FILE *)tool_stderr) {
          return 0;
        }
        if (__stream == _stdout) {
          return 0;
        }
      }
      if (tool_debug_cb::newl == false) {
        log_line_start((FILE *)__stream,local_a8,(char *)local_78,type);
      }
      curl_mfprintf(__stream,"[%zu bytes data]\n",size);
      tool_debug_cb::newl = false;
      tool_debug_cb_traced_data = 1;
      return 0;
    }
    if (type < CURLINFO_HEADER_OUT) {
      if (tool_debug_cb::newl == false) {
        log_line_start((FILE *)__stream,local_a8,(char *)local_78,type);
      }
      fwrite(data,size,1,__stream);
      if (size == 0) {
        tool_debug_cb::newl = false;
        tool_debug_cb_traced_data = 0;
        return 0;
      }
      cVar3 = data[size - 1];
    }
    else {
      if (type != CURLINFO_HEADER_OUT) {
        tool_debug_cb::newl = false;
        tool_debug_cb_traced_data = 0;
        return 0;
      }
      if (size == 0) {
        tool_debug_cb::newl = false;
        tool_debug_cb_traced_data = 0;
        return 0;
      }
      if (size == 1) {
        lVar10 = 1;
        sVar15 = 0;
        sVar9 = 0;
      }
      else {
        lVar10 = 0;
        sVar15 = 0;
        sVar2 = 1;
        do {
          sVar9 = sVar2;
          if (data[sVar9 - 1] == '\n') {
            if (tool_debug_cb::newl == false) {
              log_line_start((FILE *)__stream,local_a8,(char *)local_78,CURLINFO_HEADER_OUT);
            }
            fwrite(data + sVar15,lVar10 + sVar9,1,__stream);
            tool_debug_cb::newl = false;
            sVar15 = sVar9;
          }
          lVar10 = -sVar15;
          sVar2 = sVar9 + 1;
        } while (size != sVar9 + 1);
        lVar10 = 1 - sVar15;
      }
      if (tool_debug_cb::newl == false) {
        log_line_start((FILE *)__stream,local_a8,(char *)local_78,CURLINFO_HEADER_OUT);
      }
      fwrite(data + sVar15,lVar10 + sVar9,1,__stream);
      cVar3 = data[size - 1];
    }
    tool_debug_cb::newl = cVar3 != '\n';
    tool_debug_cb_traced_data = 0;
    return 0;
  }
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(__stream,"%s%s== Info: %.*s",local_a8,local_78,size & 0xffffffff,data);
    return 0;
  case CURLINFO_HEADER_IN:
    pcVar11 = "<= Recv header";
    break;
  case CURLINFO_HEADER_OUT:
    pcVar11 = "=> Send header";
    break;
  case CURLINFO_DATA_IN:
    pcVar11 = "<= Recv data";
    break;
  case CURLINFO_DATA_OUT:
    pcVar11 = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_IN:
    pcVar11 = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    pcVar11 = "=> Send SSL data";
    break;
  default:
    goto switchD_0010ad62_default;
  }
  curl_mfprintf(__stream,"%s%s%s, %zu bytes (0x%zx)\n",local_a8,local_78,pcVar11,size,size);
  if (size != 0) {
    local_80 = 0xfffffffffffffff0;
    if (tVar1 == TRACE_ASCII) {
      local_80 = 0xffffffffffffffc0;
    }
    lVar10 = 0x10;
    if (tVar1 == TRACE_ASCII) {
      lVar10 = 0x40;
    }
    local_88 = local_80 ^ 0xfffffffffffffffd;
    local_80 = local_80 ^ 0xfffffffffffffffe;
    uVar16 = 0;
    do {
      curl_mfprintf(__stream,"%04zx: ",uVar16);
      uVar12 = uVar16;
      lVar13 = lVar10;
      if (tVar1 == TRACE_BIN) {
        do {
          if (uVar12 < size) {
            curl_mfprintf(__stream,"%02x ",data[uVar12]);
          }
          else {
            fputs("   ",__stream);
          }
          lVar13 = lVar13 + -1;
          uVar12 = uVar12 + 1;
        } while (lVar13 != 0);
      }
      lVar13 = 0;
      uVar12 = local_80;
      pcVar11 = data;
      uVar14 = local_88;
      do {
        if (size <= uVar16 + lVar13) break;
        if (tVar1 == TRACE_ASCII) {
          if (((uVar16 + lVar13 + 1 < size) && (pcVar11[uVar16] == '\r')) &&
             (pcVar11[uVar16 + 1] == '\n')) {
            uVar16 = uVar16 - uVar12;
            break;
          }
          cVar3 = pcVar11[uVar16];
          if (0x5e < (byte)(cVar3 - 0x20U)) {
            cVar3 = '.';
          }
          curl_mfprintf(__stream,"%c",cVar3);
          if (((uVar16 + lVar13 + 2 < size) && (pcVar11[uVar16 + 1] == '\r')) &&
             (pcVar11[uVar16 + 2] == '\n')) {
            uVar16 = uVar16 - uVar14;
            break;
          }
        }
        else {
          cVar3 = pcVar11[uVar16];
          if (0x5e < (byte)(cVar3 - 0x20U)) {
            cVar3 = '.';
          }
          curl_mfprintf(__stream,"%c",cVar3);
        }
        lVar13 = lVar13 + 1;
        uVar14 = uVar14 - 1;
        uVar12 = uVar12 - 1;
        pcVar11 = pcVar11 + 1;
      } while (lVar10 != lVar13);
      fputc(10,__stream);
      uVar16 = uVar16 + lVar10;
    } while (uVar16 < size);
  }
  fflush(__stream);
switchD_0010ad62_default:
  return 0;
}

Assistant:

int tool_debug_cb(CURL *handle, curl_infotype type,
                  char *data, size_t size,
                  void *userdata)
{
  struct OperationConfig *operation = userdata;
  struct GlobalConfig *config = operation->global;
  FILE *output = tool_stderr;
  const char *text;
  struct timeval tv;
  char timebuf[20];
  /* largest signed 64-bit is: 9,223,372,036,854,775,807
   * max length in decimal: 1 + (6*3) = 19
   * formatted via TRC_IDS_FORMAT_IDS_2 this becomes 2 + 19 + 1 + 19 + 2 = 43
   * negative xfer-id are not printed, negative conn-ids use TRC_IDS_FORMAT_1
   */
  char idsbuf[60];
  curl_off_t xfer_id, conn_id;

  (void)handle; /* not used */

  if(config->tracetime) {
    tv = tvnow();
    msnprintf(timebuf, sizeof(timebuf), "%s.%06ld ",
              hms_for_sec(tv.tv_sec), (long)tv.tv_usec);
  }
  else
    timebuf[0] = 0;

  if(handle && config->traceids &&
     !curl_easy_getinfo(handle, CURLINFO_XFER_ID, &xfer_id) && xfer_id >= 0) {
    if(!curl_easy_getinfo(handle, CURLINFO_CONN_ID, &conn_id) &&
        conn_id >= 0) {
      msnprintf(idsbuf, sizeof(idsbuf), TRC_IDS_FORMAT_IDS_2,
                xfer_id, conn_id);
    }
    else {
      msnprintf(idsbuf, sizeof(idsbuf), TRC_IDS_FORMAT_IDS_1, xfer_id);
    }
  }
  else
    idsbuf[0] = 0;

  if(!config->trace_stream) {
    /* open for append */
    if(!strcmp("-", config->trace_dump))
      config->trace_stream = stdout;
    else if(!strcmp("%", config->trace_dump))
      /* Ok, this is somewhat hackish but we do it undocumented for now */
      config->trace_stream = tool_stderr;
    else {
      config->trace_stream = fopen(config->trace_dump, FOPEN_WRITETEXT);
      config->trace_fopened = TRUE;
    }
  }

  if(config->trace_stream)
    output = config->trace_stream;

  if(!output) {
    warnf(config, "Failed to create/open output");
    return 0;
  }

  if(config->tracetype == TRACE_PLAIN) {
    static bool newl = FALSE;
    static bool traced_data = FALSE;

    switch(type) {
    case CURLINFO_HEADER_OUT:
      if(size > 0) {
        size_t st = 0;
        size_t i;
        for(i = 0; i < size - 1; i++) {
          if(data[i] == '\n') { /* LF */
            if(!newl) {
              log_line_start(output, timebuf, idsbuf, type);
            }
            (void)fwrite(data + st, i - st + 1, 1, output);
            st = i + 1;
            newl = FALSE;
          }
        }
        if(!newl)
          log_line_start(output, timebuf, idsbuf, type);
        (void)fwrite(data + st, i - st + 1, 1, output);
      }
      newl = (size && (data[size - 1] != '\n')) ? TRUE : FALSE;
      traced_data = FALSE;
      break;
    case CURLINFO_TEXT:
    case CURLINFO_HEADER_IN:
      if(!newl)
        log_line_start(output, timebuf, idsbuf, type);
      (void)fwrite(data, size, 1, output);
      newl = (size && (data[size - 1] != '\n')) ? TRUE : FALSE;
      traced_data = FALSE;
      break;
    case CURLINFO_DATA_OUT:
    case CURLINFO_DATA_IN:
    case CURLINFO_SSL_DATA_IN:
    case CURLINFO_SSL_DATA_OUT:
      if(!traced_data) {
        /* if the data is output to a tty and we are sending this debug trace
           to stderr or stdout, we do not display the alert about the data not
           being shown as the data _is_ shown then just not via this
           function */
        if(!config->isatty ||
           ((output != tool_stderr) && (output != stdout))) {
          if(!newl)
            log_line_start(output, timebuf, idsbuf, type);
          fprintf(output, "[%zu bytes data]\n", size);
          newl = FALSE;
          traced_data = TRUE;
        }
      }
      break;
    default: /* nada */
      newl = FALSE;
      traced_data = FALSE;
      break;
    }

    return 0;
  }

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(output, "%s%s== Info: %.*s", timebuf, idsbuf, (int)size, data);
    FALLTHROUGH();
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  }

  dump(timebuf, idsbuf, text, output, (unsigned char *) data, size,
       config->tracetype, type);
  return 0;
}